

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

bool __thiscall inja::Parser::parse_expression_comparison(Parser *this,Template *tmpl)

{
  Token *pTVar1;
  ulong uVar2;
  const_pointer pcVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  size_t __n;
  Op op;
  Token local_48;
  
  bVar5 = parse_expression_datum(this,tmpl);
  if (bVar5) {
    bVar5 = true;
    switch((this->m_tok).kind) {
    case Id:
      uVar2 = (this->m_tok).text.size_;
      if (uVar2 == 0) {
        return true;
      }
      __n = 2;
      if (uVar2 < 2) {
        __n = uVar2;
      }
      iVar6 = bcmp((this->m_tok).text.data_,"in",__n);
      if (uVar2 != 2) {
        return true;
      }
      op = In;
      if (iVar6 != 0) {
        return true;
      }
      break;
    default:
      goto switchD_001ad439_caseD_a;
    case Equal:
      op = Equal;
      break;
    case GreaterThan:
      op = Greater;
      break;
    case GreaterEqual:
      op = GreaterEqual;
      break;
    case LessThan:
      op = Less;
      break;
    case LessEqual:
      op = LessEqual;
      break;
    case NotEqual:
      op = Different;
    }
    pTVar1 = &this->m_tok;
    if (this->m_have_peek_tok == true) {
      (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
      uVar4 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
      pcVar3 = (this->m_peek_tok).text.data_;
      pTVar1->kind = (this->m_peek_tok).kind;
      *(undefined4 *)&pTVar1->field_0x4 = uVar4;
      (this->m_tok).text.data_ = pcVar3;
      this->m_have_peek_tok = false;
    }
    else {
      Lexer::scan(&local_48,&this->m_lexer);
      (this->m_tok).text.size_ = local_48.text.size_;
      pTVar1->kind = local_48.kind;
      *(undefined4 *)&pTVar1->field_0x4 = local_48._4_4_;
      (this->m_tok).text.data_ = local_48.text.data_;
    }
    bVar5 = parse_expression_datum(this,tmpl);
    if (bVar5) {
      append_function(this,tmpl,op,2);
      return true;
    }
  }
  bVar5 = false;
switchD_001ad439_caseD_a:
  return bVar5;
}

Assistant:

bool parse_expression_comparison(Template& tmpl) {
		if (!parse_expression_datum(tmpl)) return false;
		Bytecode::Op op;
		switch (m_tok.kind) {
			case Token::Kind::Id:
				if (m_tok.text == "in")
					op = Bytecode::Op::In;
				else
					return true;
				break;
			case Token::Kind::Equal:
				op = Bytecode::Op::Equal;
				break;
			case Token::Kind::GreaterThan:
				op = Bytecode::Op::Greater;
				break;
			case Token::Kind::LessThan:
				op = Bytecode::Op::Less;
				break;
			case Token::Kind::LessEqual:
				op = Bytecode::Op::LessEqual;
				break;
			case Token::Kind::GreaterEqual:
				op = Bytecode::Op::GreaterEqual;
				break;
			case Token::Kind::NotEqual:
				op = Bytecode::Op::Different;
				break;
			default:
				return true;
		}
		get_next_token();
		if (!parse_expression_datum(tmpl)) return false;
		append_function(tmpl, op, 2);
		return true;
	}